

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamRandomAccessController_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::BamRandomAccessController::BamRandomAccessController
          (BamRandomAccessController *this)

{
  undefined8 *in_RDI;
  int local_18 [6];
  
  *in_RDI = 0;
  local_18[3] = 0xffffffff;
  local_18[2] = 0xffffffff;
  local_18[1] = 0xffffffff;
  local_18[0] = -1;
  BamRegion::BamRegion((BamRegion *)(in_RDI + 1),local_18 + 3,local_18 + 2,local_18 + 1,local_18);
  *(undefined1 *)(in_RDI + 3) = 1;
  std::__cxx11::string::string((string *)(in_RDI + 4));
  return;
}

Assistant:

BamRandomAccessController::BamRandomAccessController(void)
    : m_index(0)
    , m_hasAlignmentsInRegion(true)
{ }